

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

bool __thiscall helics::FederateState::getOptionFlag(FederateState *this,int optionFlag)

{
  bool bVar1;
  
  if (optionFlag < 0x67) {
    if (optionFlag < 0x1d) {
      switch(optionFlag) {
      case 0:
        return this->observer;
      case 1:
      case 2:
      case 3:
      case 5:
      case 7:
        break;
      case 4:
        return this->mSourceOnly;
      case 6:
switchD_002cfec9_caseD_6:
        return this->only_transmit_on_change;
      case 8:
switchD_002cfec9_caseD_8:
        return (this->interfaceInformation).only_update_on_change;
      default:
        if (optionFlag == 0x10) {
          return this->realtime;
        }
      }
    }
    else if (optionFlag < 0x26) {
      if ((optionFlag == 0x1d) || (optionFlag == 0x1f)) {
        return this->mSlowResponding;
      }
    }
    else {
      if (optionFlag == 0x26) {
        return this->reentrant;
      }
      if (optionFlag == 0x43) {
        return this->ignore_time_mismatch_warnings;
      }
      if (optionFlag == 0x48) {
        return this->terminate_on_error;
      }
    }
  }
  else if (optionFlag < 0x19c) {
    if (optionFlag < 0x18d) {
      if (optionFlag == 0x67) {
        return this->mCallbackBased;
      }
      if (optionFlag == 0x114) {
        return (((this->mLogManager)._M_t.
                 super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                 .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mLogBuffer).
               mMaxSize.super___atomic_base<unsigned_long>._M_i != 0;
      }
    }
    else {
      if (optionFlag == 0x18d) {
        return SUB41(((this->interfaceFlags).super___atomic_base<unsigned_short>._M_i & 4) >> 2,0);
      }
      if (optionFlag == 0x192) {
        return (bool)((byte)((this->interfaceFlags).super___atomic_base<unsigned_short>._M_i >> 8) &
                     1);
      }
    }
  }
  else if (optionFlag < 0x1bf) {
    if (optionFlag == 0x19c) {
      return (bool)((byte)(this->interfaceFlags).super___atomic_base<unsigned_short>._M_i >> 7);
    }
    if (optionFlag == 0x19e) {
      return this->strict_input_type_checking;
    }
  }
  else {
    if (optionFlag == 0x1bf) {
      return this->ignore_unit_mismatch;
    }
    if (optionFlag == 0x1c6) goto switchD_002cfec9_caseD_8;
    if (optionFlag == 0x1c4) goto switchD_002cfec9_caseD_6;
  }
  bVar1 = TimeCoordinator::getOptionFlag
                    ((this->timeCoord)._M_t.
                     super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                     optionFlag);
  return bVar1;
}

Assistant:

bool FederateState::getOptionFlag(int optionFlag) const
{
    switch (optionFlag) {
        case defs::Flags::ONLY_TRANSMIT_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            return only_transmit_on_change;
        case defs::Flags::ONLY_UPDATE_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            return interfaceInformation.getChangeUpdateFlag();
        case defs::Flags::REALTIME:
            return realtime;
        case defs::Flags::OBSERVER:
            return observer;
        case defs::Flags::REENTRANT:
            return reentrant;
        case defs::Flags::CALLBACK_FEDERATE:
            return mCallbackBased;
        case defs::Flags::SOURCE_ONLY:
            return mSourceOnly;
        case defs::Flags::SLOW_RESPONDING:
        case defs::Flags::DEBUGGING:
            return mSlowResponding;
        case defs::Flags::TERMINATE_ON_ERROR:
            return terminate_on_error;
        case defs::Flags::CONNECTIONS_REQUIRED:
            return ((interfaceFlags.load() & make_flags(required_flag)) != 0);
        case defs::Flags::CONNECTIONS_OPTIONAL:
            return ((interfaceFlags.load() & make_flags(optional_flag)) != 0);
        case defs::Options::RECONNECTABLE:
            return ((interfaceFlags.load() & make_flags(reconnectable_flag)) != 0);
        case defs::Flags::STRICT_INPUT_TYPE_CHECKING:
            return strict_input_type_checking;
        case defs::Flags::IGNORE_INPUT_UNIT_MISMATCH:
            return ignore_unit_mismatch;
        case defs::Flags::IGNORE_TIME_MISMATCH_WARNINGS:
            return ignore_time_mismatch_warnings;
        case defs::Properties::LOG_BUFFER:
            return (mLogManager->getLogBuffer().capacity() > 0);
            // NOTE: the allow remote control property is purposely not retrievable and should not
            // be in config generation
        default:
            return timeCoord->getOptionFlag(optionFlag);
    }
}